

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix4 * matrix4_multiply(matrix4 *self,matrix4 *mT)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  
  dVar1 = (self->field_0).m[4];
  dVar2 = (mT->field_0).m[0];
  dVar3 = (mT->field_0).m[1];
  dVar4 = (self->field_0).m[0];
  dVar5 = (self->field_0).m[1];
  dVar6 = (self->field_0).m[8];
  dVar7 = (mT->field_0).m[2];
  dVar8 = (self->field_0).m[0xc];
  dVar9 = (mT->field_0).m[3];
  dVar10 = (self->field_0).m[5];
  dVar11 = (self->field_0).m[9];
  dVar12 = (self->field_0).m[0xd];
  dVar13 = (self->field_0).m[6];
  dVar14 = (self->field_0).m[2];
  dVar15 = (self->field_0).m[10];
  dVar16 = (self->field_0).m[0xe];
  dVar17 = (self->field_0).m[7];
  dVar18 = (self->field_0).m[3];
  dVar19 = (self->field_0).m[0xb];
  dVar20 = (self->field_0).m[0xf];
  dVar21 = (mT->field_0).m[5];
  dVar22 = (mT->field_0).m[4];
  dVar23 = (mT->field_0).m[6];
  dVar24 = (mT->field_0).m[7];
  dVar25 = (mT->field_0).m[9];
  dVar26 = (mT->field_0).m[8];
  dVar27 = (mT->field_0).m[10];
  dVar28 = (mT->field_0).m[0xb];
  dVar29 = (mT->field_0).m[0xd];
  dVar30 = (mT->field_0).m[0xc];
  dVar31 = (mT->field_0).m[0xe];
  dVar32 = (mT->field_0).m[0xf];
  (self->field_0).m[0] = dVar8 * dVar9 + dVar6 * dVar7 + dVar4 * dVar2 + dVar1 * dVar3;
  (self->field_0).m[1] = dVar12 * dVar9 + dVar11 * dVar7 + dVar5 * dVar2 + dVar3 * dVar10;
  (self->field_0).m[2] = dVar16 * dVar9 + dVar15 * dVar7 + dVar14 * dVar2 + dVar3 * dVar13;
  (self->field_0).m[3] = dVar9 * dVar20 + dVar7 * dVar19 + dVar2 * dVar18 + dVar3 * dVar17;
  (self->field_0).m[4] = dVar8 * dVar24 + dVar6 * dVar23 + dVar4 * dVar22 + dVar1 * dVar21;
  (self->field_0).m[5] = dVar12 * dVar24 + dVar11 * dVar23 + dVar5 * dVar22 + dVar10 * dVar21;
  (self->field_0).m[6] = dVar16 * dVar24 + dVar15 * dVar23 + dVar14 * dVar22 + dVar13 * dVar21;
  (self->field_0).m[7] = dVar24 * dVar20 + dVar23 * dVar19 + dVar22 * dVar18 + dVar21 * dVar17;
  (self->field_0).m[8] = dVar8 * dVar28 + dVar6 * dVar27 + dVar4 * dVar26 + dVar1 * dVar25;
  (self->field_0).m[9] = dVar12 * dVar28 + dVar11 * dVar27 + dVar5 * dVar26 + dVar10 * dVar25;
  (self->field_0).m[10] = dVar16 * dVar28 + dVar15 * dVar27 + dVar14 * dVar26 + dVar13 * dVar25;
  (self->field_0).m[0xb] = dVar28 * dVar20 + dVar27 * dVar19 + dVar26 * dVar18 + dVar25 * dVar17;
  (self->field_0).m[0xc] = dVar8 * dVar32 + dVar6 * dVar31 + dVar4 * dVar30 + dVar1 * dVar29;
  (self->field_0).m[0xd] = dVar12 * dVar32 + dVar11 * dVar31 + dVar5 * dVar30 + dVar10 * dVar29;
  (self->field_0).m[0xe] = dVar16 * dVar32 + dVar15 * dVar31 + dVar14 * dVar30 + dVar13 * dVar29;
  (self->field_0).m[0xf] = dVar20 * dVar32 + dVar19 * dVar31 + dVar18 * dVar30 + dVar17 * dVar29;
  return self;
}

Assistant:

HYPAPI struct matrix4 *matrix4_multiply(struct matrix4 *self, const struct matrix4 *mT)
{
	/* mT is the multiplicand */

	struct matrix4 r;

	matrix4_identity(&r);

	/* first row */
	r.r00 = self->c00 * mT->c00 + self->c01 * mT->c10 + self->c02 * mT->c20 + self->c03 * mT->c30;
	r.r01 = self->c10 * mT->c00 + self->c11 * mT->c10 + self->c12 * mT->c20 + self->c13 * mT->c30;
	r.r02 = self->c20 * mT->c00 + self->c21 * mT->c10 + self->c22 * mT->c20 + self->c23 * mT->c30;
	r.r03 = self->c30 * mT->c00 + self->c31 * mT->c10 + self->c32 * mT->c20 + self->c33 * mT->c30;

	/* second row */
	r.r10 = self->c00 * mT->c01 + self->c01 * mT->c11 + self->c02 * mT->c21 + self->c03 * mT->c31;
	r.r11 = self->c10 * mT->c01 + self->c11 * mT->c11 + self->c12 * mT->c21 + self->c13 * mT->c31;
	r.r12 = self->c20 * mT->c01 + self->c21 * mT->c11 + self->c22 * mT->c21 + self->c23 * mT->c31;
	r.r13 = self->c30 * mT->c01 + self->c31 * mT->c11 + self->c32 * mT->c21 + self->c33 * mT->c31;

	/* third row */
	r.r20 = self->c00 * mT->c02 + self->c01 * mT->c12 + self->c02 * mT->c22 + self->c03 * mT->c32;
	r.r21 = self->c10 * mT->c02 + self->c11 * mT->c12 + self->c12 * mT->c22 + self->c13 * mT->c32;
	r.r22 = self->c20 * mT->c02 + self->c21 * mT->c12 + self->c22 * mT->c22 + self->c23 * mT->c32;
	r.r23 = self->c30 * mT->c02 + self->c31 * mT->c12 + self->c32 * mT->c22 + self->c33 * mT->c32;

	/* fourth row */
	r.r30 = self->c00 * mT->c03 + self->c01 * mT->c13 + self->c02 * mT->c23 + self->c03 * mT->c33;
	r.r31 = self->c10 * mT->c03 + self->c11 * mT->c13 + self->c12 * mT->c23 + self->c13 * mT->c33;
	r.r32 = self->c20 * mT->c03 + self->c21 * mT->c13 + self->c22 * mT->c23 + self->c23 * mT->c33;
	r.r33 = self->c30 * mT->c03 + self->c31 * mT->c13 + self->c32 * mT->c23 + self->c33 * mT->c33;

	matrix4_set(self, &r); /* overwrite/save it */

	return self;
}